

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void WriteVarInt<DataStream,(VarIntMode)1,int>(DataStream *os,int n)

{
  uint uVar1;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  uchar tmp [5];
  byte local_2e;
  byte local_2d [5];
  long local_28;
  ulong uVar2;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2d[0] = (byte)n & 0x7f;
  if (n < 0x80) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = (ulong)(uint)n;
    do {
      uVar1 = (int)(uVar2 >> 7) - 1;
      uVar2 = (ulong)uVar1;
      local_2d[uVar3 + 1] = (byte)uVar1 | 0x80;
      uVar3 = uVar3 + 1;
      bVar4 = 0x407f < (uint)n;
      n = uVar1;
    } while (bVar4);
    uVar3 = uVar3 & 0xffffffff;
  }
  do {
    local_2e = local_2d[uVar3];
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os,
               (os->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_2e,local_2d);
    bVar4 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteVarInt(Stream& os, I n)
{
    CheckVarIntMode<Mode, I>();
    unsigned char tmp[(sizeof(n)*8+6)/7];
    int len=0;
    while(true) {
        tmp[len] = (n & 0x7F) | (len ? 0x80 : 0x00);
        if (n <= 0x7F)
            break;
        n = (n >> 7) - 1;
        len++;
    }
    do {
        ser_writedata8(os, tmp[len]);
    } while(len--);
}